

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

uint ctl_arena_init(tsd_t *tsd,arena_config_t *config)

{
  uint ind;
  ctl_arena_t *pcVar1;
  ctl_arena_t *pcVar2;
  ctl_arenas_t *pcVar3;
  ctl_arena_t *pcVar4;
  ctl_arena_t *pcVar5;
  arena_t *paVar6;
  uint uVar7;
  
  pcVar3 = ctl_arenas;
  pcVar5 = (ctl_arenas->destroyed).qlh_first;
  if ((pcVar5 == (ctl_arena_t *)0x0) ||
     (pcVar4 = (pcVar5->destroyed_link).qre_prev, pcVar4 == (ctl_arena_t *)0x0)) {
    pcVar4 = (ctl_arena_t *)&ctl_arenas->narenas;
  }
  else {
    if (pcVar5 == pcVar4) {
      pcVar5 = (pcVar5->destroyed_link).qre_next;
      (ctl_arenas->destroyed).qlh_first = pcVar5;
    }
    if (pcVar5 == pcVar4) {
      (pcVar3->destroyed).qlh_first = (ctl_arena_t *)0x0;
    }
    else {
      pcVar5 = (pcVar4->destroyed_link).qre_prev;
      pcVar1 = (((pcVar4->destroyed_link).qre_next)->destroyed_link).qre_prev;
      (pcVar5->destroyed_link).qre_next = pcVar1;
      pcVar2 = (pcVar4->destroyed_link).qre_next;
      (pcVar2->destroyed_link).qre_prev = pcVar5;
      (pcVar4->destroyed_link).qre_prev = pcVar1;
      (((pcVar2->destroyed_link).qre_prev)->destroyed_link).qre_next = pcVar2;
      (pcVar1->destroyed_link).qre_next = pcVar4;
    }
  }
  ind = pcVar4->arena_ind;
  pcVar5 = arenas_i_impl(tsd,(ulong)ind,false,true);
  uVar7 = 0xffffffff;
  if (((pcVar5 != (ctl_arena_t *)0x0) &&
      (paVar6 = duckdb_je_arena_init((tsdn_t *)tsd,ind,config), paVar6 != (arena_t *)0x0)) &&
     (uVar7 = ind, ind == ctl_arenas->narenas)) {
    ctl_arenas->narenas = ind + 1;
  }
  return uVar7;
}

Assistant:

static unsigned
ctl_arena_init(tsd_t *tsd, const arena_config_t *config) {
	unsigned arena_ind;
	ctl_arena_t *ctl_arena;

	if ((ctl_arena = ql_last(&ctl_arenas->destroyed, destroyed_link)) !=
	    NULL) {
		ql_remove(&ctl_arenas->destroyed, ctl_arena, destroyed_link);
		arena_ind = ctl_arena->arena_ind;
	} else {
		arena_ind = ctl_arenas->narenas;
	}

	/* Trigger stats allocation. */
	if (arenas_i_impl(tsd, arena_ind, false, true) == NULL) {
		return UINT_MAX;
	}

	/* Initialize new arena. */
	if (arena_init(tsd_tsdn(tsd), arena_ind, config) == NULL) {
		return UINT_MAX;
	}

	if (arena_ind == ctl_arenas->narenas) {
		ctl_arenas->narenas++;
	}

	return arena_ind;
}